

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O1

int YPSpur_md_near_pos(YPSpur *spur,int cs,double x,double y,double r)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x72;
  local_40.cs = cs;
  local_40.data[0] = x;
  local_40.data[1] = y;
  local_40.data[2] = r;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  if ((iVar1 < 0) || (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_40), iVar1 < 0)) {
    spur->connection_error = 1;
    local_40.cs = -1;
  }
  return local_40.cs;
}

Assistant:

int YPSpur_md_near_pos(YPSpur* spur, int cs, double x, double y, double r)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_NEAR_POS;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = r;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  return msg.cs;
}